

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

void __thiscall FileBuffer::loadSegment(FileBuffer *this,int segment,int loadToPosition)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ifstream *this_00;
  ulong uVar4;
  int local_48;
  int i;
  int bufferIndexStart;
  int readChars;
  ifstream *fileStream;
  char *innerBuffer;
  int fileSegmentStartPos;
  int loadToPosition_local;
  int segment_local;
  FileBuffer *this_local;
  
  iVar1 = this->_fileSegmentLength;
  uVar4 = (ulong)this->_fileSegmentLength;
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar4);
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00);
  std::ifstream::open(this_00,this->_file,8);
  std::istream::seekg((long)this_00,segment * iVar1);
  std::istream::read((char *)this_00,(long)pvVar3);
  iVar2 = std::istream::gcount();
  std::ifstream::close();
  iVar1 = this->_fileSegmentLength;
  for (local_48 = 0; local_48 < this->_fileSegmentLength && local_48 < iVar2;
      local_48 = local_48 + 1) {
    this->_buffer[iVar1 * loadToPosition + local_48] = *(char *)((long)pvVar3 + (long)local_48);
  }
  this->_loadedSegments[loadToPosition] = segment;
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void FileBuffer::loadSegment(int segment, int loadToPosition) {
    //printf("Loading segment %d to position %d\n", segment, loadToPosition);
    //char **actualPosition = (char **) (&_buffer + (_fileSegmentLength * loadToPosition));



    int fileSegmentStartPos = segment * _fileSegmentLength;
    char *innerBuffer = new char[_fileSegmentLength];

    ifstream *fileStream = new ifstream();
    fileStream->open(_file);
    fileStream->seekg(fileSegmentStartPos, ios::beg);
    fileStream->read(innerBuffer, _fileSegmentLength);
    int readChars = (int) fileStream->gcount();
    fileStream->close();

    int bufferIndexStart = _fileSegmentLength * loadToPosition;

    for (int i = 0; i < _fileSegmentLength && i < readChars; i++) {
        _buffer[bufferIndexStart + i] = innerBuffer[i];
    }

    _loadedSegments[loadToPosition] = segment;

    delete[] innerBuffer;
}